

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O3

string * __thiscall
soul::PaddedStringTable::getRow_abi_cxx11_
          (string *__return_storage_ptr__,PaddedStringTable *this,size_t rowIndex)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  long *plVar4;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (*(ulong *)&this->field_0x10 <= rowIndex) {
    throwInternalCompilerError("index < numActive","operator[]",0x9f);
  }
  uVar1 = *(ulong *)(*(long *)&this->rows + 8 + rowIndex * 0x118);
  if (uVar1 != 0) {
    plVar4 = (long *)(*(long *)&this->rows + rowIndex * 0x118);
    lVar3 = 0;
    uVar2 = 0;
    do {
      if (uVar2 < uVar1 - 1) {
        if ((uVar1 <= uVar2) || (*(ulong *)&this->field_0x11a8 <= uVar2)) {
          throwInternalCompilerError("index < numActive","operator[]",0x9f);
        }
        padded(&local_50,(string *)(*plVar4 + lVar3),
               this->numExtraSpaces + *(int *)(*(long *)&this->columnWidths + uVar2 * 8));
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,*(ulong *)(*plVar4 + lVar3));
      }
      uVar2 = uVar2 + 1;
      uVar1 = plVar4[1];
      lVar3 = lVar3 + 0x20;
    } while (uVar2 < uVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PaddedStringTable::getRow (size_t rowIndex) const
{
    std::string s;
    auto& row = rows[rowIndex];

    for (size_t i = 0; i < row.size(); ++i)
    {
        if (i < row.size() - 1)
            s += padded (row[i], (int) columnWidths[i] + numExtraSpaces);
        else
            s += row[i];
    }

    return s;
}